

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O0

bool bssl::ssl_parse_cert_chain
               (uint8_t *out_alert,UniquePtr<struct_stack_st_CRYPTO_BUFFER> *out_chain,
               UniquePtr<EVP_PKEY> *out_pubkey,uint8_t *out_leaf_sha256,CBS *cbs,
               CRYPTO_BUFFER_POOL *pool)

{
  bool bVar1;
  enable_if_t<_internal::StackTraits<stack_st_CRYPTO_BUFFER>::kIsConst,_bool> eVar2;
  int iVar3;
  size_t sVar4;
  stack_st_CRYPTO_BUFFER *__p;
  pointer psVar5;
  uint8_t *d;
  CRYPTO_BUFFER *__p_00;
  byte local_e1;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_a0;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_98;
  UniquePtr<CRYPTO_BUFFER> buf;
  undefined1 local_88 [8];
  CBS certificate;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_68;
  UniquePtr<EVP_PKEY> pubkey;
  unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> local_58;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> chain;
  CBS certificate_list;
  CRYPTO_BUFFER_POOL *pool_local;
  CBS *cbs_local;
  uint8_t *out_leaf_sha256_local;
  UniquePtr<EVP_PKEY> *out_pubkey_local;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> *out_chain_local;
  uint8_t *out_alert_local;
  
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset(out_chain,(pointer)0x0);
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::reset(out_pubkey,(pointer)0x0);
  iVar3 = CBS_get_u24_length_prefixed(cbs,(CBS *)&chain);
  if (iVar3 == 0) {
    *out_alert = '2';
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                  ,0x85);
    out_alert_local._7_1_ = 0;
  }
  else {
    sVar4 = CBS_len((CBS *)&chain);
    if (sVar4 == 0) {
      out_alert_local._7_1_ = 1;
    }
    else {
      __p = sk_CRYPTO_BUFFER_new_null();
      std::unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<stack_st_CRYPTO_BUFFER,bssl::internal::Deleter> *)&local_58,__p);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_58);
      if (bVar1) {
        std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_68);
        do {
          sVar4 = CBS_len((CBS *)&chain);
          if (sVar4 == 0) {
            std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::operator=
                      (out_chain,&local_58);
            std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator=(out_pubkey,&local_68);
            out_alert_local._7_1_ = 1;
            pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._4_4_ = 1;
            break;
          }
          iVar3 = CBS_get_u24_length_prefixed((CBS *)&chain,(CBS *)local_88);
          if ((iVar3 == 0) || (sVar4 = CBS_len((CBS *)local_88), sVar4 == 0)) {
            *out_alert = '2';
            ERR_put_error(0x10,0,0x7f,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                          ,0x99);
            out_alert_local._7_1_ = 0;
            pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._4_4_ = 1;
            break;
          }
          psVar5 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get(&local_58);
          sVar4 = sk_CRYPTO_BUFFER_num(psVar5);
          if (sVar4 == 0) {
            ssl_cert_parse_pubkey((bssl *)&buf,(CBS *)local_88);
            std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator=
                      (&local_68,(unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&buf);
            std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&buf);
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_68);
            if (!bVar1) {
              *out_alert = '2';
              out_alert_local._7_1_ = 0;
              pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._4_4_ = 1;
              break;
            }
            if (out_leaf_sha256 != (uint8_t *)0x0) {
              d = CBS_data((CBS *)local_88);
              sVar4 = CBS_len((CBS *)local_88);
              SHA256(d,sVar4,out_leaf_sha256);
            }
          }
          __p_00 = CRYPTO_BUFFER_new_from_CBS((CBS *)local_88,pool);
          std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
          unique_ptr<bssl::internal::Deleter,void>
                    ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&local_98,__p_00);
          bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_98);
          local_e1 = 1;
          if (bVar1) {
            psVar5 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                               (&local_58);
            std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::unique_ptr
                      (&local_a0,&local_98);
            eVar2 = PushToStack<stack_st_CRYPTO_BUFFER>(psVar5,&local_a0);
            local_e1 = eVar2 ^ 0xff;
            std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_a0);
          }
          pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._4_1_ = (local_e1 & 1) != 0;
          if (pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._4_1_) {
            *out_alert = 'P';
            out_alert_local._7_1_ = 0;
          }
          pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._5_3_ = 0;
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_98);
        } while (pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._4_4_ == 0);
        std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_68);
      }
      else {
        *out_alert = 'P';
        out_alert_local._7_1_ = 0;
        pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._4_4_ = 1;
      }
      std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr(&local_58);
    }
  }
  return (bool)(out_alert_local._7_1_ & 1);
}

Assistant:

bool ssl_parse_cert_chain(uint8_t *out_alert,
                          UniquePtr<STACK_OF(CRYPTO_BUFFER)> *out_chain,
                          UniquePtr<EVP_PKEY> *out_pubkey,
                          uint8_t *out_leaf_sha256, CBS *cbs,
                          CRYPTO_BUFFER_POOL *pool) {
  out_chain->reset();
  out_pubkey->reset();

  CBS certificate_list;
  if (!CBS_get_u24_length_prefixed(cbs, &certificate_list)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  if (CBS_len(&certificate_list) == 0) {
    return true;
  }

  UniquePtr<STACK_OF(CRYPTO_BUFFER)> chain(sk_CRYPTO_BUFFER_new_null());
  if (!chain) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  UniquePtr<EVP_PKEY> pubkey;
  while (CBS_len(&certificate_list) > 0) {
    CBS certificate;
    if (!CBS_get_u24_length_prefixed(&certificate_list, &certificate) ||
        CBS_len(&certificate) == 0) {
      *out_alert = SSL_AD_DECODE_ERROR;
      OPENSSL_PUT_ERROR(SSL, SSL_R_CERT_LENGTH_MISMATCH);
      return false;
    }

    if (sk_CRYPTO_BUFFER_num(chain.get()) == 0) {
      pubkey = ssl_cert_parse_pubkey(&certificate);
      if (!pubkey) {
        *out_alert = SSL_AD_DECODE_ERROR;
        return false;
      }

      // Retain the hash of the leaf certificate if requested.
      if (out_leaf_sha256 != NULL) {
        SHA256(CBS_data(&certificate), CBS_len(&certificate), out_leaf_sha256);
      }
    }

    UniquePtr<CRYPTO_BUFFER> buf(
        CRYPTO_BUFFER_new_from_CBS(&certificate, pool));
    if (!buf ||  //
        !PushToStack(chain.get(), std::move(buf))) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return false;
    }
  }

  *out_chain = std::move(chain);
  *out_pubkey = std::move(pubkey);
  return true;
}